

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_store.cpp
# Opt level: O1

buffer * __thiscall mpt::value_store::reserve(value_store *this,long count,type_traits *traits)

{
  buffer *pbVar1;
  long lVar2;
  
  if (count < 0) {
    if (*(long *)this == 0) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)(*(long *)this + 0x18);
    }
  }
  else {
    lVar2 = count * traits->size;
  }
  pbVar1 = (buffer *)mpt_array_reserve(this,lVar2);
  if (pbVar1 == (buffer *)0x0) {
    pbVar1 = (buffer *)0x0;
  }
  else {
    lVar2 = mpt_array_slice(this,0,lVar2);
    if (lVar2 == 0) {
      pbVar1 = (buffer *)0x0;
    }
  }
  return pbVar1;
}

Assistant:

buffer *value_store::reserve(long count, const struct type_traits &traits)
{
	size_t len;
	if (count < 0) {
		const array::content *buf = _d.data();
		len = buf ? buf->length() : 0;
	} else {
		len = count * traits.size;
	}
	buffer *buf = mpt_array_reserve(&_d, len, &traits);
	if (!buf || !mpt_array_slice(&_d, 0, len)) {
		return 0;
	}
	return buf;
}